

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void dump(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *points,vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *clusters)

{
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  const_reference pvVar3;
  reference puVar4;
  const_reference this;
  size_type sVar5;
  ostream *this_00;
  const_reference pvVar6;
  ulong local_50;
  size_t k;
  value_type *point;
  unsigned_long *index;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  size_t c;
  vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *clusters_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *points_local;
  
  __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while( true ) {
    pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::size
                       (clusters);
    if (pvVar2 <= __range2) break;
    pvVar3 = std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::operator[]
                       (clusters,(size_type)__range2);
    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&pvVar3->members);
    index = (unsigned_long *)
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&pvVar3->members);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)&index);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2);
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](points,*puVar4);
      std::ostream::operator<<((ostream *)&std::cout,(ulong)__range2);
      local_50 = 0;
      while( true ) {
        sVar5 = std::vector<double,_std::allocator<double>_>::size(this);
        if (sVar5 <= local_50) break;
        this_00 = std::operator<<((ostream *)&std::cout," ");
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this,local_50);
        std::ostream::operator<<(this_00,*pvVar6);
        local_50 = local_50 + 1;
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
    __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(__range2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void dump(const std::vector<Container>& points,
    const std::vector<msc::Cluster<Scalar>>& clusters)
{
    for (std::size_t c = 0; c < clusters.size(); c++)
    {
        for (const auto& index : clusters[c].members)
        {
            const auto& point = points[index];
            std::cout << c;
            for (std::size_t k = 0; k < point.size(); k++)
                std::cout << " " << point[k];
            std::cout << std::endl;
        }
    }
}